

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Data<QHashPrivate::Node<QString,_QByteArray>_> *
QHashPrivate::Data<QHashPrivate::Node<QString,_QByteArray>_>::detached
          (Data<QHashPrivate::Node<QString,_QByteArray>_> *d,size_t size)

{
  bool bVar1;
  void *in_RDI;
  Data<QHashPrivate::Node<QString,_QByteArray>_> *dd;
  size_t in_stack_00000028;
  RefCount *in_stack_ffffffffffffffc8;
  Data<QHashPrivate::Node<QString,_QByteArray>_> *in_stack_ffffffffffffffd0;
  Data<QHashPrivate::Node<QString,_QByteArray>_> *in_stack_ffffffffffffffd8;
  Data<QHashPrivate::Node<QString,_QByteArray>_> *in_stack_ffffffffffffffe0;
  Data<QHashPrivate::Node<QString,_QByteArray>_> *local_8;
  
  if (in_RDI == (void *)0x0) {
    local_8 = (Data<QHashPrivate::Node<QString,_QByteArray>_> *)operator_new(0x28);
    Data(in_stack_ffffffffffffffd0,(size_t)local_8);
  }
  else {
    local_8 = (Data<QHashPrivate::Node<QString,_QByteArray>_> *)operator_new(0x28);
    Data(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_00000028);
    bVar1 = QtPrivate::RefCount::deref(in_stack_ffffffffffffffc8);
    if ((!bVar1) && (in_RDI != (void *)0x0)) {
      ~Data(in_stack_ffffffffffffffe0);
      operator_delete(in_RDI,0x28);
    }
  }
  return local_8;
}

Assistant:

static Data *detached(Data *d, size_t size)
    {
        if (!d)
            return new Data(size);
        Data *dd = new Data(*d, size);
        if (!d->ref.deref())
            delete d;
        return dd;
    }